

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distributions.h
# Opt level: O2

enable_if_t<_std::is_same<int,_void>::value,_int>
absl::lts_20250127::
Uniform<int,absl::lts_20250127::random_internal::NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,absl::lts_20250127::random_internal::RandenPoolSeedSeq>&>
          (NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,_absl::lts_20250127::random_internal::RandenPoolSeedSeq>
           *urbg,int lo,int hi)

{
  int local_8;
  int local_4;
  
  _local_8 = CONCAT44(lo,hi);
  if (lo <= hi + -1) {
    lo = random_internal::
         DistributionCaller<absl::lts_20250127::random_internal::NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,absl::lts_20250127::random_internal::RandenPoolSeedSeq>>
         ::Impl<absl::lts_20250127::random_internal::UniformDistributionWrapper<int>,int&,int&>
                   (urbg,&local_4,&local_8);
  }
  return lo;
}

Assistant:

typename absl::enable_if_t<!std::is_same<R, void>::value, R>  //
Uniform(URBG&& urbg,  // NOLINT(runtime/references)
        R lo, R hi) {
  using gen_t = absl::decay_t<URBG>;
  using distribution_t = random_internal::UniformDistributionWrapper<R>;
  constexpr auto tag = absl::IntervalClosedOpen;

  auto a = random_internal::uniform_lower_bound(tag, lo, hi);
  auto b = random_internal::uniform_upper_bound(tag, lo, hi);
  if (!random_internal::is_uniform_range_valid(a, b)) return lo;

  return random_internal::DistributionCaller<gen_t>::template Call<
      distribution_t>(&urbg, lo, hi);
}